

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::emitEnumDefinition(PrintC *this,TypeEnum *ct)

{
  EmitXml *pEVar1;
  unsigned_long uVar2;
  bool bVar3;
  type_metatype tVar4;
  uint uVar5;
  long lVar6;
  LowlevelError *this_00;
  reference ppVar7;
  undefined8 uVar8;
  _Self local_78;
  _Self local_70;
  _Base_ptr local_68;
  uint local_5c;
  byte local_56;
  undefined1 local_55;
  int4 id;
  bool sign;
  allocator local_41;
  string local_40 [32];
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  const_iterator iter;
  TypeEnum *ct_local;
  PrintC *this_local;
  
  iter._M_node = (_Base_ptr)ct;
  std::
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_20);
  Datatype::getName_abi_cxx11_((Datatype *)iter._M_node);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 != 0) {
    PrintLanguage::pushMod(&this->super_PrintLanguage);
    tVar4 = Datatype::getMetatype((Datatype *)iter._M_node);
    local_56 = tVar4 == TYPE_INT;
    (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"typedef enum",0);
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
    local_5c = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"{",8);
    (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    local_68 = (_Base_ptr)TypeEnum::beginEnum_abi_cxx11_(iter._M_node);
    local_20._M_node = local_68;
    while( true ) {
      local_70._M_node = (_Base_ptr)TypeEnum::endEnum_abi_cxx11_(iter._M_node);
      bVar3 = std::operator!=(&local_20,&local_70);
      if (!bVar3) break;
      pEVar1 = (this->super_PrintLanguage).emit;
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator*(&local_20);
      uVar8 = std::__cxx11::string::c_str();
      (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,uVar8,5);
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"=",8);
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&local_20);
      uVar2 = ppVar7->first;
      uVar5 = Datatype::getSize((Datatype *)iter._M_node);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])
                (this,uVar2,(ulong)uVar5,(ulong)(local_56 & 1),0);
      PrintLanguage::recurse(&this->super_PrintLanguage);
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,";",8);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_20);
      local_78._M_node = (_Base_ptr)TypeEnum::endEnum_abi_cxx11_(iter._M_node);
      bVar3 = std::operator!=(&local_20,&local_78);
      if (bVar3) {
        (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
      }
    }
    PrintLanguage::popMod(&this->super_PrintLanguage);
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x23])(pEVar1,(ulong)local_5c);
    (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"}",8);
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
    pEVar1 = (this->super_PrintLanguage).emit;
    Datatype::getName_abi_cxx11_((Datatype *)iter._M_node);
    uVar8 = std::__cxx11::string::c_str();
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,uVar8,8);
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,";",8);
    return;
  }
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])();
  local_55 = 1;
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Trying to save unnamed enumeration",&local_41);
  LowlevelError::LowlevelError(this_00,(string *)local_40);
  local_55 = 0;
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void PrintC::emitEnumDefinition(const TypeEnum *ct)

{
  map<uintb,string>::const_iterator iter;

  if (ct->getName().size()==0) {
    clear();
    throw LowlevelError("Trying to save unnamed enumeration");
  }

  pushMod();
  bool sign = (ct->getMetatype() == TYPE_INT);
  emit->tagLine();
  emit->print("typedef enum",EmitXml::keyword_color);
  emit->spaces(1);
  int4 id = emit->startIndent();
  emit->print("{");
  emit->tagLine();
  iter = ct->beginEnum();
  while(iter!=ct->endEnum()) {
    emit->print((*iter).second.c_str(),EmitXml::const_color);
    emit->spaces(1);
    emit->print("=",EmitXml::no_color);
    emit->spaces(1);
    push_integer((*iter).first,ct->getSize(),sign,(Varnode *)0,
		 (PcodeOp *)0);
    recurse();
    emit->print(";");
    ++iter;
    if (iter != ct->endEnum())
      emit->tagLine();
  }
  popMod();
  emit->stopIndent(id);
  emit->tagLine();
  emit->print("}");
  emit->spaces(1);
  emit->print(ct->getName().c_str());
  emit->print(";");
}